

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_primitive_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::javanano::RepeatedPrimitiveFieldGenerator::GenerateMergingCode
          (RepeatedPrimitiveFieldGenerator *this,Printer *printer)

{
  JavaType JVar1;
  Printer *printer_local;
  RepeatedPrimitiveFieldGenerator *this_local;
  
  io::Printer::Print(printer,&this->variables_,
                     "int arrayLength = com.google.protobuf.nano.WireFormatNano\n    .getRepeatedFieldArrayLength(input, $non_packed_tag$);\nint i = this.$name$ == null ? 0 : this.$name$.length;\n"
                    );
  JVar1 = GetJavaType(this->descriptor_);
  if (JVar1 == JAVATYPE_BYTES) {
    io::Printer::Print(printer,&this->variables_,
                       "byte[][] newArray = new byte[i + arrayLength][];\n");
  }
  else {
    io::Printer::Print(printer,&this->variables_,
                       "$type$[] newArray = new $type$[i + arrayLength];\n");
  }
  io::Printer::Print(printer,&this->variables_,
                     "if (i != 0) {\n  java.lang.System.arraycopy(this.$name$, 0, newArray, 0, i);\n}\nfor (; i < newArray.length - 1; i++) {\n  newArray[i] = input.read$capitalized_type$();\n  input.readTag();\n}\n// Last one without readTag.\nnewArray[i] = input.read$capitalized_type$();\nthis.$name$ = newArray;\n"
                    );
  return;
}

Assistant:

void RepeatedPrimitiveFieldGenerator::
GenerateMergingCode(io::Printer* printer) const {
  // First, figure out the length of the array, then parse.
  printer->Print(variables_,
    "int arrayLength = com.google.protobuf.nano.WireFormatNano\n"
    "    .getRepeatedFieldArrayLength(input, $non_packed_tag$);\n"
    "int i = this.$name$ == null ? 0 : this.$name$.length;\n");

  if (GetJavaType(descriptor_) == JAVATYPE_BYTES) {
    printer->Print(variables_,
      "byte[][] newArray = new byte[i + arrayLength][];\n");
  } else {
    printer->Print(variables_,
      "$type$[] newArray = new $type$[i + arrayLength];\n");
  }
  printer->Print(variables_,
    "if (i != 0) {\n"
    "  java.lang.System.arraycopy(this.$name$, 0, newArray, 0, i);\n"
    "}\n"
    "for (; i < newArray.length - 1; i++) {\n"
    "  newArray[i] = input.read$capitalized_type$();\n"
    "  input.readTag();\n"
    "}\n"
    "// Last one without readTag.\n"
    "newArray[i] = input.read$capitalized_type$();\n"
    "this.$name$ = newArray;\n");
}